

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall
GlobOpt::PRE::InsertPropertySymPreloadInLandingPad
          (PRE *this,Instr *ldInstr,Loop *loop,PropertySym *propertySym)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  bool bVar1;
  ValueNumber VVar2;
  ValueNumber VVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  GlobOptBlockData *pGVar6;
  PropertySym *pPVar7;
  Value *this_01;
  Value *this_02;
  PropertySymOpnd *pPVar8;
  StackSym *pSVar9;
  PropertySymOpnd *newPropSymOpnd;
  PropertySymOpnd *propSymOpnd;
  Value *val2;
  Value *val1;
  SymOpnd *ldSrc;
  PropertySym *propertySym_local;
  Loop *loop_local;
  Instr *ldInstr_local;
  PRE *this_local;
  
  pOVar4 = IR::Instr::GetSrc1(ldInstr);
  pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
  if ((PropertySym *)pSVar5->m_sym == propertySym) {
LAB_0057c976:
    pOVar4 = IR::Instr::GetSrc1(ldInstr);
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
    pSVar5->m_sym = &propertySym->super_Sym;
    pOVar4 = IR::Instr::GetSrc1(ldInstr);
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
    bVar1 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (bVar1) {
      pPVar8 = IR::Opnd::AsPropertySymOpnd(&pSVar5->super_Opnd);
      pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)pPVar8);
      pPVar8 = IR::PropertySymOpnd::CopyWithoutFlowSensitiveInfo(pPVar8,this->globOpt->func);
      IR::Instr::ReplaceSrc1(ldInstr,(Opnd *)pPVar8);
    }
    pOVar4 = IR::Instr::GetDst(ldInstr);
    if (pOVar4 != (Opnd *)0x0) {
      this_00 = (loop->landingPad->globOptData).liveVarSyms;
      pOVar4 = IR::Instr::GetDst(ldInstr);
      pSVar9 = IR::Opnd::GetStackSym(pOVar4);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pSVar9->super_Sym).m_id);
    }
    InsertInstrInLandingPad(this,ldInstr,loop);
    this_local = (PRE *)ldInstr;
  }
  else {
    pGVar6 = CurrentBlockData(this->globOpt);
    pPVar7 = Sym::AsPropertySym(pSVar5->m_sym);
    this_01 = GlobOptBlockData::FindValue(pGVar6,&pPVar7->m_stackSym->super_Sym);
    pGVar6 = CurrentBlockData(this->globOpt);
    this_02 = GlobOptBlockData::FindValue(pGVar6,&propertySym->m_stackSym->super_Sym);
    if ((this_01 != (Value *)0x0) && (this_02 != (Value *)0x0)) {
      VVar2 = ::Value::GetValueNumber(this_01);
      VVar3 = ::Value::GetValueNumber(this_02);
      if (VVar2 == VVar3) goto LAB_0057c976;
    }
    this_local = (PRE *)0x0;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
GlobOpt::PRE::InsertPropertySymPreloadInLandingPad(IR::Instr * ldInstr, Loop * loop, PropertySym * propertySym)
{
    IR::SymOpnd *ldSrc = ldInstr->GetSrc1()->AsSymOpnd();

    if (ldSrc->m_sym != propertySym)
    {
        // It's possible that the property syms are different but have equivalent objPtrs. Verify their values.
        Value *val1 = globOpt->CurrentBlockData()->FindValue(ldSrc->m_sym->AsPropertySym()->m_stackSym);
        Value *val2 = globOpt->CurrentBlockData()->FindValue(propertySym->m_stackSym);
        if (!val1 || !val2 || val1->GetValueNumber() != val2->GetValueNumber())
        {
            return nullptr;
        }
    }

    // Consider: Shouldn't be necessary once we have copy-prop in prepass...
    ldInstr->GetSrc1()->AsSymOpnd()->m_sym = propertySym;
    ldSrc = ldInstr->GetSrc1()->AsSymOpnd();

    if (ldSrc->IsPropertySymOpnd())
    {
        IR::PropertySymOpnd *propSymOpnd = ldSrc->AsPropertySymOpnd();
        IR::PropertySymOpnd *newPropSymOpnd;

        newPropSymOpnd = propSymOpnd->AsPropertySymOpnd()->CopyWithoutFlowSensitiveInfo(this->globOpt->func);
        ldInstr->ReplaceSrc1(newPropSymOpnd);
    }

    if (ldInstr->GetDst())
    {
        loop->landingPad->globOptData.liveVarSyms->Set(ldInstr->GetDst()->GetStackSym()->m_id);
    }

    InsertInstrInLandingPad(ldInstr, loop);

    return ldInstr;
}